

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

int lest::version(ostream *os)

{
  ostream *poVar1;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"lest version ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(os,"1.35.1",6);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Compiled with ",0xe);
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"clang ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
             ,0x5f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1a8,local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," on ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Apr 26 2025",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"19:43:18",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"For more information, see https://github.com/martinmoene/lest.\n",0x3f);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  return 0;
}

Assistant:

inline int version( std::ostream & os )
{
    os << "lest version "  << lest_VERSION << "\n"
       << "Compiled with " << compiler()   << " on " << __DATE__ << " at " << __TIME__ << ".\n"
       << "For more information, see https://github.com/martinmoene/lest.\n";
    return 0;
}